

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.hpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine::
shaderCollectionForSamplingRoutine(shaderCollectionForSamplingRoutine *this)

{
  shaderCollectionForSamplingRoutine *this_local;
  
  shaderDefinition::shaderDefinition(&this->pass_through_vertex_shader);
  shaderDefinition::shaderDefinition(&this->pass_through_tesselation_control_shader);
  shaderDefinition::shaderDefinition(&this->sampling_compute_shader);
  shaderDefinition::shaderDefinition(&this->sampling_fragment_shader);
  shaderDefinition::shaderDefinition(&this->sampling_geometry_shader);
  shaderDefinition::shaderDefinition(&this->sampling_tesselation_control_shader);
  shaderDefinition::shaderDefinition(&this->sampling_tesselation_evaluation_shader);
  shaderDefinition::shaderDefinition(&this->sampling_vertex_shader);
  this->m_sampling_function = Texture;
  return;
}

Assistant:

shaderCollectionForSamplingRoutine() : m_sampling_function(Texture)
		{
		}